

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O1

string * libwebm::GetTempFileName_abi_cxx11_(void)

{
  ulong __n;
  ulong uVar1;
  int __fd;
  char *pcVar2;
  size_t sVar3;
  long *plVar4;
  char *pcVar5;
  long *plVar6;
  string *in_RDI;
  string temp_file_name_template_str;
  long *local_70;
  ulong local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pcVar2 = getenv("TEST_TMPDIR");
  pcVar5 = ".";
  if (pcVar2 != (char *)0x0) {
    pcVar5 = pcVar2;
  }
  local_50[0] = local_40;
  sVar3 = strlen(pcVar5);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar5,pcVar5 + sVar3);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar6;
    local_70 = (long *)*plVar4;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  uVar1 = local_68;
  __n = local_68 + 1;
  pcVar5 = (char *)operator_new__(__n);
  memset(pcVar5,0,__n);
  std::__cxx11::string::copy((char *)&local_70,(ulong)pcVar5,uVar1);
  __fd = mkstemp(pcVar5);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if (__fd == -1) {
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
  }
  else {
    strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>();
  }
  operator_delete__(pcVar5);
  if (__fd != -1) {
    close(__fd);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  return in_RDI;
}

Assistant:

std::string GetTempFileName() {
#if !defined _MSC_VER && !defined __MINGW32__
  std::string temp_file_name_template_str =
      std::string(std::getenv("TEST_TMPDIR") ? std::getenv("TEST_TMPDIR")
                                             : ".") +
      "/libwebm_temp.XXXXXX";
  char* temp_file_name_template =
      new char[temp_file_name_template_str.length() + 1];
  memset(temp_file_name_template, 0, temp_file_name_template_str.length() + 1);
  temp_file_name_template_str.copy(temp_file_name_template,
                                   temp_file_name_template_str.length(), 0);
  int fd = mkstemp(temp_file_name_template);
  std::string temp_file_name =
      (fd != -1) ? std::string(temp_file_name_template) : std::string();
  delete[] temp_file_name_template;
  if (fd != -1) {
    close(fd);
  }
  return temp_file_name;
#else
  char tmp_file_name[_MAX_PATH];
#if defined _MSC_VER || defined MINGW_HAS_SECURE_API
  errno_t err = tmpnam_s(tmp_file_name);
#else
  char* fname_pointer = tmpnam(tmp_file_name);
  int err = (fname_pointer == &tmp_file_name[0]) ? 0 : -1;
#endif
  if (err == 0) {
    return std::string(tmp_file_name);
  }
  return std::string();
#endif
}